

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

void __thiscall
Fixpp::impl::FieldGroupVisitor<Fixpp::FieldRef<Fixpp::TagT<401u,Fixpp::Type::Int>>>::operator()
          (FieldGroupVisitor<Fixpp::FieldRef<Fixpp::TagT<401u,Fixpp::Type::Int>>> *this,
          FieldRef<Fixpp::TagT<401U,_Fixpp::Type::Int>_> *field,ParsingContext *context,
          TagSet<Fixpp::TagT<399U,_Fixpp::Type::Int>,_Fixpp::TagT<400U,_Fixpp::Type::String>,_Fixpp::TagT<401U,_Fixpp::Type::Int>,_Fixpp::TagT<404U,_Fixpp::Type::Float>,_Fixpp::TagT<441U,_Fixpp::Type::Int>,_Fixpp::TagT<402U,_Fixpp::Type::Float>,_Fixpp::TagT<403U,_Fixpp::Type::Float>,_Fixpp::TagT<405U,_Fixpp::Type::Float>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<407U,_Fixpp::Type::Float>,_Fixpp::TagT<408U,_Fixpp::Type::Float>_>
          *param_3,bool param_4,bool param_5)

{
  StreamCursor *this_00;
  long lVar1;
  char *pcVar2;
  StreamBuf<char> *pSVar3;
  long lVar4;
  char cVar5;
  long lVar6;
  bool bVar7;
  
  this_00 = context->cursor;
  lVar1 = *(long *)&this_00->buf->field_0x8;
  pcVar2 = *(char **)&this_00->buf->field_0x10;
  while( true ) {
    pSVar3 = this_00->buf;
    if (*(long *)&pSVar3->field_0x18 == *(long *)&pSVar3->field_0x10) {
      lVar6 = (**(code **)(*(long *)pSVar3 + 0x38))();
      bVar7 = lVar6 == 0;
    }
    else {
      bVar7 = false;
    }
    if (bVar7) {
      ParsingContext::setError(context,ParsingError,"Expected value after tag %d, got EOF",0x191);
      return;
    }
    pSVar3 = this_00->buf;
    if (*(char **)&pSVar3->field_0x10 < *(char **)&pSVar3->field_0x18) {
      cVar5 = **(char **)&pSVar3->field_0x10;
    }
    else {
      cVar5 = (**(code **)(*(long *)pSVar3 + 0x48))();
    }
    if (cVar5 == '|') break;
    StreamCursor::advance(this_00,1);
  }
  lVar6 = *(long *)&this_00->buf->field_0x10;
  lVar4 = *(long *)&this_00->buf->field_0x8;
  (field->m_view).first = pcVar2;
  (field->m_view).second = (lVar1 + lVar6) - (long)(pcVar2 + lVar4);
  return;
}

Assistant:

void operator()(Field& field,
                            ParsingContext& context, TagSet&, bool, bool)
            {
                static constexpr auto Tag = Field::Tag::Id;
                auto& cursor = context.cursor;

                StreamCursor::Token valueToken(cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value after tag %d, got EOF", Tag);

                auto view = valueToken.view();

                field.set(view);
            }